

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O3

RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> * __thiscall
Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::operator=
          (RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *this,
          ShaderResourceBindingVkImpl *pObj)

{
  RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> local_28;
  
  RefCntWeakPtr(&local_28,pObj);
  if (this->m_pRefCounters != local_28.m_pRefCounters) {
    Release(this);
    this->m_pRefCounters = local_28.m_pRefCounters;
    this->m_pObject = local_28.m_pObject;
    local_28.m_pRefCounters = (RefCountersImpl *)0x0;
    local_28.m_pObject = (ShaderResourceBindingVkImpl *)0x0;
  }
  Release(&local_28);
  return this;
}

Assistant:

RefCntWeakPtr& operator=(T* pObj) noexcept
    {
        return operator=(RefCntWeakPtr(pObj));
    }